

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O0

int mg_session_write_container_size(mg_session *session,uint32_t size,uint8_t *markers)

{
  uint in_ESI;
  int status_2;
  int status_1;
  int status;
  uint32_t in_stack_ffffffffffffffcc;
  uint8_t val;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  val = (uint8_t)(in_stack_ffffffffffffffcc >> 0x18);
  if (in_ESI < 0x10) {
    local_4 = mg_session_write_uint8
                        ((mg_session *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         ,val);
  }
  else if (in_ESI < 0x100) {
    local_4 = mg_session_write_uint8
                        ((mg_session *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         ,val);
    if (local_4 == 0) {
      local_4 = mg_session_write_uint8
                          ((mg_session *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (uint8_t)(in_stack_ffffffffffffffcc >> 0x18));
    }
  }
  else if (in_ESI < 0x10000) {
    local_4 = mg_session_write_uint8
                        ((mg_session *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         ,val);
    if (local_4 == 0) {
      local_4 = mg_session_write_uint16
                          ((mg_session *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    }
  }
  else {
    local_4 = mg_session_write_uint8
                        ((mg_session *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         ,val);
    if (local_4 == 0) {
      local_4 = mg_session_write_uint32
                          ((mg_session *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc)
      ;
    }
  }
  return local_4;
}

Assistant:

int mg_session_write_container_size(mg_session *session, uint32_t size,
                                    const uint8_t *markers) {
  if (size <= MG_TINY_SIZE_MAX) {
    return mg_session_write_uint8(session, (uint8_t)(markers[0] + size));
  }
  if (size <= UINT8_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, markers[1]));
    return mg_session_write_uint8(session, (uint8_t)size);
  }
  if (size <= UINT16_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, markers[2]));
    return mg_session_write_uint16(session, (uint16_t)size);
  }
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, markers[3]));
  return mg_session_write_uint32(session, size);
}